

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

bool __thiscall Config::Read(Config *this,string *filename,bool nowarn)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  string line;
  string val;
  string key;
  char buf [4096];
  string local_1100;
  Config *local_10e0;
  char *local_10d8;
  char *local_10d0;
  char local_10c8;
  undefined7 uStack_10c7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b8;
  double dStack_10b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1098;
  bool local_1088;
  bool bStack_1087;
  bool bStack_1086;
  bool bStack_1085;
  bool bStack_1084;
  undefined3 uStack_1083;
  var_type local_1080;
  string local_1078;
  key_type local_1058;
  char local_1038 [4104];
  
  local_10d8 = &local_10c8;
  local_10d0 = (char *)0x0;
  local_10c8 = '\0';
  local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
  local_1058._M_string_length = 0;
  local_1058.field_2._M_local_buf[0] = '\0';
  local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
  local_1078._M_string_length = 0;
  local_1078.field_2._M_local_buf[0] = '\0';
  local_10e0 = this;
  std::__cxx11::string::_M_assign((string *)&this->filename);
  __stream = fopen((filename->_M_dataplus)._M_p,"rt");
  if (__stream == (FILE *)0x0) {
    if (nowarn) {
LAB_0012e9db:
      bVar2 = false;
    }
    else {
      bVar2 = false;
      Console::Wrn("Configuration file not found: %s",(filename->_M_dataplus)._M_p);
    }
  }
  else {
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
LAB_0012e63e:
      pcVar4 = fgets(local_1038,0x1000,__stream);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::_M_replace((ulong)&local_10d8,0,local_10d0,0x1a38e9);
      }
      else {
        local_1100._M_dataplus._M_p = (pointer)&local_1100.field_2;
        sVar5 = strlen(local_1038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1100,local_1038,local_1038 + sVar5);
        util::trim((string *)&local_10b8,&local_1100);
        std::__cxx11::string::operator=((string *)&local_10d8,(string *)&local_10b8);
        if (local_10b8 != &local_10a8) {
          operator_delete(local_10b8,(ulong)(local_10a8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
          operator_delete(local_1100._M_dataplus._M_p,local_1100.field_2._M_allocated_capacity + 1);
        }
      }
      if (((local_10d0 != (char *)0x0) && (*local_10d8 != '#')) &&
         (lVar6 = std::__cxx11::string::find((char)&local_10d8,0x3d), lVar6 != -1)) {
        std::__cxx11::string::substr((ulong)&local_1100,(ulong)&local_10d8);
        util::rtrim((string *)&local_10b8,&local_1100);
        std::__cxx11::string::operator=((string *)&local_1058,(string *)&local_10b8);
        if (local_10b8 != &local_10a8) {
          operator_delete(local_10b8,(ulong)(local_10a8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
          operator_delete(local_1100._M_dataplus._M_p,local_1100.field_2._M_allocated_capacity + 1);
        }
        if ((char *)(lVar6 + 1U) < local_10d0) {
          std::__cxx11::string::substr((ulong)&local_1100,(ulong)&local_10d8);
          util::ltrim((string *)&local_10b8,&local_1100);
          std::__cxx11::string::operator=((string *)&local_1078,(string *)&local_10b8);
          if (local_10b8 != &local_10a8) {
            operator_delete(local_10b8,(ulong)(local_10a8._M_allocated_capacity + 1));
          }
          uVar9 = local_1100.field_2._M_allocated_capacity;
          _Var10._M_p = local_1100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
LAB_0012e824:
            operator_delete(_Var10._M_p,(ulong)(uVar9 + 1));
          }
        }
        else {
          local_10b8 = &local_10a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b8,"");
          std::__cxx11::string::operator=((string *)&local_1078,(string *)&local_10b8);
          uVar9 = local_10a8._M_allocated_capacity;
          _Var10._M_p = (pointer)local_10b8;
          if (local_10b8 != &local_10a8) goto LAB_0012e824;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_1058);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_1058);
          if ((iVar3 != 0) &&
             (iVar3 = std::__cxx11::string::compare((char *)&local_1058), iVar3 != 0)) {
LAB_0012e883:
            uVar7 = std::__cxx11::string::find((char)&local_1078,0x5c);
            if ((uVar7 == 0xffffffffffffffff) || (uVar7 == local_1078._M_string_length))
            goto LAB_0012e952;
            bVar1 = local_1078._M_dataplus._M_p[uVar7 + 1];
            if (bVar1 < 0x72) {
              if (bVar1 != 0x5c) {
                if (bVar1 == 0x6e) {
                  pcVar4 = "\n";
                  goto LAB_0012e8e9;
                }
                goto LAB_0012e883;
              }
              pcVar4 = "\\";
            }
            else {
              pcVar4 = "\r";
              if (bVar1 == 0x72) goto LAB_0012e8e9;
              if (bVar1 != 0x74) goto LAB_0012e883;
              pcVar4 = "\t";
            }
LAB_0012e8e9:
            std::__cxx11::string::replace((ulong)&local_1078,uVar7,(char *)0x2,(ulong)pcVar4);
            goto LAB_0012e883;
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_1058);
          Read(local_10e0,&local_1078,iVar3 == 0);
          goto LAB_0012e9ba;
        }
        bVar2 = Read(local_10e0,&local_1078,false);
        if (!bVar2) goto LAB_0012e9db;
      }
      goto LAB_0012e9ba;
    }
LAB_0012e9ca:
    fclose(__stream);
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
    operator_delete(local_1078._M_dataplus._M_p,
                    CONCAT71(local_1078.field_2._M_allocated_capacity._1_7_,
                             local_1078.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p,
                    CONCAT71(local_1058.field_2._M_allocated_capacity._1_7_,
                             local_1058.field_2._M_local_buf[0]) + 1);
  }
  if (local_10d8 != &local_10c8) {
    operator_delete(local_10d8,CONCAT71(uStack_10c7,local_10c8) + 1);
  }
  return bVar2;
LAB_0012e952:
  util::variant::variant((variant *)&local_10b8,&local_1078);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_10e0,&local_1058);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)pmVar8 = local_10b8;
  pmVar8->val_float = dStack_10b0;
  std::__cxx11::string::operator=((string *)&pmVar8->val_string,(string *)local_10a8._M_local_buf);
  pmVar8->type = local_1080;
  pmVar8->val_bool = local_1088;
  pmVar8->cache_val[0] = bStack_1087;
  pmVar8->cache_val[1] = bStack_1086;
  pmVar8->cache_val[2] = bStack_1085;
  pmVar8->cache_val[3] = bStack_1084;
  *(undefined3 *)&pmVar8->field_0x35 = uStack_1083;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a8._M_allocated_capacity != &local_1098) {
    operator_delete((void *)local_10a8._M_allocated_capacity,local_1098._M_allocated_capacity + 1);
  }
LAB_0012e9ba:
  iVar3 = feof(__stream);
  if (iVar3 != 0) goto LAB_0012e9ca;
  goto LAB_0012e63e;
}

Assistant:

bool Config::Read(const std::string& filename, bool nowarn)
{
	std::FILE *fh;
	char buf[Config::MaxLineLength];
	std::string line;
	std::string key;
	std::string val;
	std::size_t eqloc;

	this->filename = filename;

	fh = std::fopen(filename.c_str(), "rt");
	if (!fh)
	{
		if (!nowarn)
			Console::Wrn("Configuration file not found: %s", filename.c_str());
		return false;
	}

	while (!std::feof(fh))
	{
		if (std::fgets(buf, Config::MaxLineLength, fh))
		{
			line = util::trim(buf);
		}
		else
		{
			line = "";
		}

		if (line.length() < 1)
		{
			continue;
		}

		if (line[0] == '#')
		{
			continue;
		}

		eqloc = line.find('=');

		if (eqloc == std::string::npos)
		{
			continue;
		}

		key = util::rtrim(line.substr(0, eqloc));

		if (line.length() > eqloc+1)
		{
			val = util::ltrim(line.substr(eqloc+1));
		}
		else
		{
			val = std::string("");
		}

		if (key == "REQUIRE")
		{
			if (!this->Read(val))
				return false;
		}
		else if (key == "INCLUDE" || key == "INCLUDE_NOWARN")
		{
			bool nowarn = (key == "INCLUDE_NOWARN");
			this->Read(val, nowarn);
		}
		else
		{
			std::size_t loc = val.find('\\');
			while (loc != std::string::npos && loc != val.length())
			{
				if (val[loc + 1] == 't')
				{
					val.replace(loc, 2, "\t");
				}
				else if (val[loc + 1] == 'r')
				{
					val.replace(loc, 2, "\r");
				}
				else if (val[loc + 1] == 'n')
				{
					val.replace(loc, 2, "\n");
				}
				else if (val[loc + 1] == '\\')
				{
					val.replace(loc, 2, "\\");
				}

				loc = val.find('\\', loc+1);
			}

			this->operator[](key) = static_cast<util::variant>(val);
		}
	}

	std::fclose(fh);
	return true;
}